

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               MessageFactory *factory,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  MapValueRef *__x;
  MapKey *in_RCX;
  Message *in_RDX;
  MapValueRef *in_RSI;
  Message *in_R8;
  MapEntryMessageComparator comparator;
  Message *map_entry_message;
  MapIterator iter;
  Message *prototype;
  Descriptor *map_entry_desc;
  int i;
  RepeatedPtrField<google::protobuf::Message> *map_field;
  MapFieldBase *base;
  bool need_release;
  Reflection *in_stack_fffffffffffffeb8;
  Reflection *in_stack_fffffffffffffec0;
  Message *in_stack_fffffffffffffec8;
  MapEntryMessageComparator in_stack_fffffffffffffed0;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  in_stack_fffffffffffffee0;
  Reflection *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  byte in_stack_fffffffffffffef7;
  Reflection *in_stack_fffffffffffffef8;
  MapIterator local_90;
  long *local_60;
  Descriptor *local_58;
  Message *local_50;
  int local_44;
  RepeatedPtrField<google::protobuf::Message> *local_40;
  MapFieldBase *local_38;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar4;
  
  bVar4 = 0;
  local_38 = Reflection::GetMapData
                       ((Reflection *)in_stack_fffffffffffffed0.field_,in_stack_fffffffffffffec8,
                        (FieldDescriptor *)in_stack_fffffffffffffec0);
  bVar2 = MapFieldBase::IsRepeatedFieldValid((MapFieldBase *)in_stack_fffffffffffffec0);
  if (bVar2) {
    local_40 = Reflection::GetRepeatedPtrField<google::protobuf::Message>
                         (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8,
                          (FieldDescriptor *)0x43859f);
    for (local_44 = 0; iVar1 = local_44,
        iVar3 = RepeatedPtrField<google::protobuf::Message>::size
                          ((RepeatedPtrField<google::protobuf::Message> *)0x4385ca), iVar1 < iVar3;
        local_44 = local_44 + 1) {
      local_50 = RepeatedPtrField<google::protobuf::Message>::Mutable
                           ((RepeatedPtrField<google::protobuf::Message> *)in_stack_fffffffffffffec0
                            ,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::push_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   *)in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
    }
  }
  else {
    local_58 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffec0);
    local_60 = (long *)(*(code *)(((in_RCX->val_).string_value_)->field_2)._M_allocated_capacity)
                                 (in_RCX,local_58);
    Reflection::MapBegin
              (in_stack_fffffffffffffef8,
               (Message *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (FieldDescriptor *)in_stack_fffffffffffffee8);
    while( true ) {
      Reflection::MapEnd(in_stack_fffffffffffffef8,
                         (Message *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                         (FieldDescriptor *)in_stack_fffffffffffffee8);
      in_stack_fffffffffffffef7 =
           protobuf::operator!=
                     ((MapIterator *)in_stack_fffffffffffffec0,
                      (MapIterator *)in_stack_fffffffffffffeb8);
      MapIterator::~MapIterator((MapIterator *)in_stack_fffffffffffffec0);
      if ((in_stack_fffffffffffffef7 & 1) == 0) break;
      in_stack_fffffffffffffeb8 = (Reflection *)(**(code **)(*local_60 + 0x18))();
      in_stack_fffffffffffffee8 = in_stack_fffffffffffffeb8;
      in_stack_fffffffffffffee0._M_current = (Message **)MapIterator::GetKey(&local_90);
      in_stack_fffffffffffffed0.field_ = (FieldDescriptor *)in_stack_fffffffffffffeb8;
      in_stack_fffffffffffffed8._M_current = (Message **)Descriptor::field(local_58,0);
      CopyKey(in_RCX,in_R8,(FieldDescriptor *)CONCAT17(bVar4,in_stack_ffffffffffffffd0));
      __x = MapIterator::GetValueRef(&local_90);
      in_stack_fffffffffffffec0 = (Reflection *)Descriptor::field(local_58,1);
      CopyValue(in_RSI,in_RDX,(FieldDescriptor *)in_RCX);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::push_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   *)in_stack_fffffffffffffed0.field_,(value_type *)__x);
      MapIterator::operator++((MapIterator *)in_stack_fffffffffffffec0);
    }
    MapIterator::~MapIterator((MapIterator *)in_stack_fffffffffffffec0);
    bVar4 = 1;
  }
  FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffec0);
  MapEntryMessageComparator::MapEntryMessageComparator
            ((MapEntryMessageComparator *)in_stack_fffffffffffffec0,
             (Descriptor *)in_stack_fffffffffffffeb8);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::begin((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           *)in_stack_fffffffffffffeb8);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::end((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
         *)in_stack_fffffffffffffeb8);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,google::protobuf::MapEntryMessageComparator>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  return (bool)(bVar4 & 1);
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, MessageFactory* factory,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrField<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO(teboring): For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype = factory->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}